

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void __thiscall rlist::listDel(rlist *this)

{
  listNode *plVar1;
  listNode *tmp;
  rlist *this_local;
  
  this->view = this->rl->head;
  while (this->view != (listNode *)0x0) {
    plVar1 = this->view;
    this->view = this->view->next;
    if (plVar1 != (listNode *)0x0) {
      operator_delete(plVar1);
    }
  }
  return;
}

Assistant:

void rlist::listDel(){
      view=rl->head;
      listNode *tmp=NULL;
      while(view!=NULL){
            tmp=view;
            view=view->next;
            delete tmp;
      }
}